

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGccDepfileReader.cxx
# Opt level: O3

int testGccDepfileReader(int argc,char **argv)

{
  long *plVar1;
  pointer pbVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  undefined8 *puVar6;
  ostream *poVar7;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  pointer pbVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dst;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  ulong uVar12;
  bool bVar13;
  string base;
  string __str_1;
  string depfile;
  cmGccDepfileContent expected;
  string plainDepfile;
  optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_> actual;
  string line;
  string dataDirPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_398;
  long local_388;
  undefined8 uStack_380;
  undefined1 local_378 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_360;
  long *local_348;
  long local_340;
  long local_338 [2];
  vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_> local_328;
  string local_308;
  _Storage<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>,_false>
  local_2e8;
  byte local_2d0;
  string local_2c8;
  undefined1 local_2a8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_278;
  long *local_258;
  long local_250;
  long local_248 [2];
  undefined1 local_238 [520];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid arguments.\n",0x13);
    uVar8 = 0xffffffff;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,argv[1],(allocator<char> *)local_238);
    std::__cxx11::string::append((char *)&local_258);
    uVar8 = 1;
    bVar13 = true;
    do {
      local_238._0_8_ = local_238 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_258,local_250 + (long)local_258);
      std::__cxx11::string::append((char *)local_238);
      local_378._0_8_ = local_378 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_378,'\x01');
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_378._0_8_,1,uVar8);
      pbVar11 = (pointer)0xf;
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        pbVar11 = (pointer)CONCAT71(local_238._17_7_,local_238[0x10]);
      }
      pbVar2 = (pointer)((long)&((_Alloc_hider *)local_378._8_8_)->_M_p + local_238._8_8_);
      if (pbVar11 < pbVar2) {
        pbVar11 = (pointer)0xf;
        if ((pointer)local_378._0_8_ != (pointer)(local_378 + 0x10)) {
          pbVar11 = (pointer)local_378._16_8_;
        }
        if (pbVar11 < pbVar2) goto LAB_001ae9bb;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)local_378,0,(char *)0x0,local_238._0_8_);
      }
      else {
LAB_001ae9bb:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append(local_238,local_378._0_8_);
      }
      local_398 = &local_388;
      plVar1 = puVar6 + 2;
      if ((long *)*puVar6 == plVar1) {
        local_388 = *plVar1;
        uStack_380 = puVar6[3];
      }
      else {
        local_388 = *plVar1;
        local_398 = (long *)*puVar6;
      }
      lVar9 = puVar6[1];
      *puVar6 = plVar1;
      puVar6[1] = 0;
      *(undefined1 *)plVar1 = 0;
      if ((pointer)local_378._0_8_ != (pointer)(local_378 + 0x10)) {
        operator_delete((void *)local_378._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_378._16_8_)->_M_p + 1));
      }
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
      }
      local_348 = local_338;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_348,local_398,lVar9 + (long)local_398);
      std::__cxx11::string::append((char *)&local_348);
      local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_308,local_398,lVar9 + (long)local_398);
      std::__cxx11::string::append((char *)&local_308);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Comparing ",10);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_398,lVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," with ",6);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_308._M_dataplus._M_p,local_308._M_string_length);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      local_238._8_8_ = 0;
      local_238[0x10] = '\0';
      local_238._0_8_ = local_238 + 0x10;
      cmReadGccDepfile((optional<std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>_>
                        *)&local_2e8._M_value,(char *)local_348,(string *)local_238,All);
      if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
        operator_delete((void *)local_238._0_8_,CONCAT71(local_238._17_7_,local_238[0x10]) + 1);
      }
      bVar3 = cmsys::SystemTools::FileExists(&local_308);
      if (bVar3) {
        if (local_2d0 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Reading ",8);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_348,local_340);
          lVar9 = 0x17;
          pcVar10 = " should have succeeded\n";
          goto LAB_001af066;
        }
        local_328.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_328.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_328.super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::ifstream::ifstream(local_238,local_308._M_dataplus._M_p,_S_in);
        cVar4 = std::__basic_file<char>::is_open();
        if (cVar4 != '\0') {
          local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
          local_2c8._M_string_length = 0;
          local_2c8.field_2._M_local_buf[0] = '\0';
          vStack_360.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          vStack_360.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_378._16_8_ = (pointer)0x0;
          vStack_360.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_378._0_8_ = (pointer)0x0;
          local_378._8_8_ = (pointer)0x0;
          bVar3 = true;
LAB_001aec4f:
          do {
            this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&vStack_360;
            if (bVar3) {
              this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_378;
            }
            while( true ) {
              bVar3 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)local_238,&local_2c8,(bool *)0x0,0xffffffffffffffff);
              if (!bVar3) {
                if (local_378._0_8_ != local_378._8_8_) {
                  std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::
                  emplace_back<cmGccStyleDependency>(&local_328,(cmGccStyleDependency *)local_378);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&vStack_360);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_378);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                  operator_delete(local_2c8._M_dataplus._M_p,
                                  CONCAT71(local_2c8.field_2._M_allocated_capacity._1_7_,
                                           local_2c8.field_2._M_local_buf[0]) + 1);
                }
                goto LAB_001aee57;
              }
              iVar5 = std::__cxx11::string::compare((char *)&local_2c8);
              bVar3 = iVar5 == 0;
              if (bVar3) break;
              iVar5 = std::__cxx11::string::compare((char *)&local_2c8);
              if (iVar5 == 0) goto LAB_001aec4f;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(this,&local_2c8);
              local_2a8._8_8_ = (pointer)0x0;
              local_2a8._16_8_ = local_2a8._16_8_ & 0xffffffffffffff00;
              local_2a8._0_8_ = (pointer)(local_2a8 + 0x10);
              std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_2a8);
              if ((pointer)local_2a8._0_8_ != (pointer)(local_2a8 + 0x10)) {
                operator_delete((void *)local_2a8._0_8_,
                                (ulong)((long)&((_Alloc_hider *)local_2a8._16_8_)->_M_p + 1));
              }
            }
            if (local_378._0_8_ != local_378._8_8_) {
              std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::
              emplace_back<cmGccStyleDependency>(&local_328,(cmGccStyleDependency *)local_378);
              local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_378._16_8_;
              local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_378._8_8_;
              local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_378._0_8_;
              local_290.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_290.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_290.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_378._16_8_ = (pointer)0x0;
              local_378._0_8_ = (pointer)0x0;
              local_378._8_8_ = (pointer)0x0;
              local_2a8._0_8_ = (pointer)0x0;
              local_2a8._8_8_ = (pointer)0x0;
              local_2a8._16_8_ = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_278);
              local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   vStack_360.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   vStack_360.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_278.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   vStack_360.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              vStack_360.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_290.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              vStack_360.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   local_290.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              vStack_360.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_290.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_290.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_290.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_290.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_278);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_290);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2a8);
            }
          } while( true );
        }
LAB_001aee57:
        std::ifstream::~ifstream(local_238);
        if ((long)local_2e8._M_value.
                  super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                  _M_impl.super__Vector_impl_data._M_finish - local_2e8._0_8_ ==
            (long)local_328.
                  super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_328.
                  super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
          if (local_2e8._M_value.
              super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              local_2e8._M_value.
              super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            lVar9 = 0x18;
            uVar12 = 0;
            do {
              bVar3 = anon_unknown.dwarf_9faf5::compare
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)((long)local_2e8._M_value.
                                           super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar9 + -0x18
                                    ),(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)((long)local_328.
                                                super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar9 + -0x18),"Rules differ: ");
              if ((!bVar3) ||
                 (bVar3 = anon_unknown.dwarf_9faf5::compare
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&((local_2e8._M_value.
                                                  super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rules)
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar9),
                                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)&((local_328.
                                                  super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rules)
                                                .
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + lVar9),
                                     "Paths differ: "), !bVar3)) goto LAB_001af162;
              uVar12 = uVar12 + 1;
              lVar9 = lVar9 + 0x30;
            } while (uVar12 < (ulong)(((long)local_2e8._M_value.
                                             super__Vector_base<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       local_2e8._0_8_ >> 4) * -0x5555555555555555));
          }
          std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                    (&local_328);
          goto LAB_001aef48;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expected ",9);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," entries.",9);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        poVar7 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Actual number of entries: ",0x1a)
        ;
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
LAB_001af162:
        anon_unknown.dwarf_9faf5::dump("actual",&local_2e8._M_value);
        anon_unknown.dwarf_9faf5::dump("expected",&local_328);
        std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                  (&local_328);
LAB_001af19c:
        if (local_2d0 == 1) {
          local_2d0 = 0;
          std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                    (&local_2e8._M_value);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._M_dataplus._M_p != &local_308.field_2) {
          operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
        }
        if (local_348 != local_338) {
          operator_delete(local_348,local_338[0] + 1);
        }
        if (local_398 != &local_388) {
          operator_delete(local_398,local_388 + 1);
        }
        uVar8 = (uint)bVar13;
        goto LAB_001af217;
      }
      if (local_2d0 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Reading ",8);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_348,local_340);
        lVar9 = 0x14;
        pcVar10 = " should have failed\n";
LAB_001af066:
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar9);
        goto LAB_001af19c;
      }
LAB_001aef48:
      if ((local_2d0 & 1) != 0) {
        local_2d0 = 0;
        std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::~vector
                  (&local_2e8._M_value);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_dataplus._M_p != &local_308.field_2) {
        operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
      }
      if (local_348 != local_338) {
        operator_delete(local_348,local_338[0] + 1);
      }
      if (local_398 != &local_388) {
        operator_delete(local_398,local_388 + 1);
      }
      bVar13 = uVar8 < 7;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 8);
    uVar8 = 0;
LAB_001af217:
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
  }
  return uVar8;
}

Assistant:

int testGccDepfileReader(int argc, char* argv[])
{
  if (argc < 2) {
    std::cout << "Invalid arguments.\n";
    return -1;
  }

  std::string dataDirPath = argv[1];
  dataDirPath += "/testGccDepfileReader_data";
  const int numberOfTestFiles = 7; // 6th file doesn't exist
  for (int i = 1; i <= numberOfTestFiles; ++i) {
    const std::string base = dataDirPath + "/deps" + std::to_string(i);
    const std::string depfile = base + ".d";
    const std::string plainDepfile = base + ".txt";
    std::cout << "Comparing " << base << " with " << plainDepfile << std::endl;
    const auto actual = cmReadGccDepfile(depfile.c_str());
    if (cmSystemTools::FileExists(plainDepfile)) {
      if (!actual) {
        std::cerr << "Reading " << depfile << " should have succeeded\n";
        return 1;
      }
      const auto expected = readPlainDepfile(plainDepfile.c_str());
      if (!compare(*actual, expected)) {
        dump("actual", *actual);
        dump("expected", expected);
        return 1;
      }
    } else if (actual) {
      std::cerr << "Reading " << depfile << " should have failed\n";
      return 1;
    }
  }

  return 0;
}